

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgradientreconstruction.cpp
# Opt level: O0

void __thiscall
TPZGradientReconstruction::TPZGradientData::Print(TPZGradientData *this,ostream *out)

{
  double *pdVar1;
  TPZManVector<double,_3> *pTVar2;
  ostream *poVar3;
  int64_t iVar4;
  ostream *in_RSI;
  long in_RDI;
  int j;
  int i;
  char string [256];
  char *name7;
  char *name6;
  char *name5;
  char *name4;
  char *name3;
  char *name2;
  char *name1;
  int local_150;
  int local_14c;
  char local_148 [256];
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  ostream *local_10;
  
  local_18 = "Cell average";
  local_20 = "Center Point";
  local_28 = "Gradient";
  local_30 = "Slope limiter";
  local_38 = "Cel";
  local_40 = "Neigh";
  local_48 = "Center Point Interface";
  local_10 = in_RSI;
  std::operator<<(in_RSI,"\n\n");
  sprintf(local_148,"\t%s",local_18);
  std::operator<<(local_10,local_148);
  sprintf(local_148,"\t%s",local_20);
  std::operator<<(local_10,local_148);
  sprintf(local_148,"\t\t%s",local_28);
  std::operator<<(local_10,local_148);
  sprintf(local_148,"\t\t%s",local_30);
  std::operator<<(local_10,local_148);
  std::operator<<(local_10,"\n");
  sprintf(local_148,"%s",local_38);
  std::operator<<(local_10,local_148);
  std::operator<<(local_10,"\t");
  poVar3 = local_10;
  pdVar1 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x10),0);
  std::ostream::operator<<(poVar3,*pdVar1);
  std::operator<<(local_10,"\t(");
  for (local_150 = 0; local_150 < 3; local_150 = local_150 + 1) {
    pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                       ((TPZVec<TPZManVector<double,_3>_> *)(in_RDI + 0x80),0);
    pdVar1 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,(long)local_150);
    sprintf(local_148,"%f",*pdVar1);
    std::operator<<(local_10,local_148);
    if (local_150 < 2) {
      std::operator<<(local_10,",");
    }
  }
  std::operator<<(local_10,")");
  std::operator<<(local_10,"\t(");
  for (local_14c = 0; poVar3 = local_10, local_14c < 3; local_14c = local_14c + 1) {
    pdVar1 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x520),(long)local_14c);
    std::ostream::operator<<(poVar3,*pdVar1);
    if (local_14c < 2) {
      std::operator<<(local_10,",");
    }
  }
  std::operator<<(local_10,")");
  poVar3 = std::operator<<(local_10,"\t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x558));
  std::operator<<(poVar3,"\n");
  local_14c = 1;
  while( true ) {
    iVar4 = TPZVec<double>::size((TPZVec<double> *)(in_RDI + 0x10));
    if (iVar4 <= local_14c) break;
    poVar3 = std::operator<<(local_10,local_40);
    std::ostream::operator<<(poVar3,local_14c);
    poVar3 = std::operator<<(local_10,"\t");
    pdVar1 = TPZVec<double>::operator[]((TPZVec<double> *)(in_RDI + 0x10),(long)local_14c);
    std::ostream::operator<<(poVar3,*pdVar1);
    std::operator<<(local_10,"\t(");
    for (local_150 = 0; poVar3 = local_10, local_150 < 3; local_150 = local_150 + 1) {
      pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                         ((TPZVec<TPZManVector<double,_3>_> *)(in_RDI + 0x80),(long)local_14c);
      pdVar1 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,(long)local_150);
      std::ostream::operator<<(poVar3,*pdVar1);
      if (local_150 < 2) {
        std::operator<<(local_10,",");
      }
    }
    std::operator<<(local_10,")\n");
    local_14c = local_14c + 1;
  }
  poVar3 = std::operator<<(local_10,"\n\n");
  poVar3 = std::operator<<(poVar3,local_48);
  std::operator<<(poVar3,"\n");
  local_14c = 0;
  while( true ) {
    iVar4 = TPZVec<TPZManVector<double,_3>_>::size
                      ((TPZVec<TPZManVector<double,_3>_> *)(in_RDI + 0x2d0));
    if (iVar4 <= local_14c) break;
    std::operator<<(local_10,"(");
    for (local_150 = 0; local_150 < 3; local_150 = local_150 + 1) {
      pTVar2 = TPZVec<TPZManVector<double,_3>_>::operator[]
                         ((TPZVec<TPZManVector<double,_3>_> *)(in_RDI + 0x2d0),(long)local_14c);
      pdVar1 = TPZVec<double>::operator[](&pTVar2->super_TPZVec<double>,(long)local_150);
      sprintf(local_148,"%f",*pdVar1);
      std::operator<<(local_10,local_148);
      if (local_150 < 2) {
        std::operator<<(local_10,",");
      }
    }
    std::operator<<(local_10,")\n");
    local_14c = local_14c + 1;
  }
  return;
}

Assistant:

void TPZGradientReconstruction::TPZGradientData::Print(std::ostream &out) const
{
    const char *name1 = "Cell average";
    const char *name2 = "Center Point";
    const char *name3 = "Gradient";
    const char *name4 = "Slope limiter";
    
    const char *name5 = "Cel";
    const char *name6 = "Neigh";
    const char *name7 = "Center Point Interface";
    
    char string[256];
    
    out<<"\n\n";
    sprintf(string, "\t%s", name1);
    out << string ;
    sprintf(string, "\t%s", name2);
    out << string ;
    sprintf(string, "\t\t%s", name3);
    out << string ;
    sprintf(string, "\t\t%s", name4);
    out << string ;
    out<<"\n";
    
    sprintf(string, "%s", name5);
    out << string ;
    
    out << "\t" ;
    out << fSolCellAndNeighbors[0];
    
    int i, j;
    out<<"\t(";
    for(j=0; j<3; j++ ){
        sprintf(string, "%f", fCenterPointCellAndNeighbors[0][j]);
        out << string;
        if (j<2) out<<",";
    }
    out <<")";
    
    out<<"\t(";
    for(i=0; i<3; i++ ){
        out << fGradient[i];
        if (i<2) out<<",";
    }
    out <<")";
    
    out << "\t" << fSlopeLimiter << "\n";
    
    
    for (i=1; i<fSolCellAndNeighbors.size(); i++)
    {
        out << name6 <<i;
        
        out << "\t" << fSolCellAndNeighbors[i];
        
        out<<"\t(";
        for(j=0; j<3; j++ ){
            out << fCenterPointCellAndNeighbors[i][j];
            if (j<2) out<<",";
        }
        out <<")\n";
    }
    //Interface
    out <<"\n\n" << name7 <<"\n";
    for (i=0; i<fCenterPointInterface.size(); i++)
    {
        out<<"(";
        for(j=0; j<3; j++ ){
            sprintf(string, "%f", fCenterPointInterface[i][j]);
            out << string;
            if (j<2) out<<",";
        }
        out <<")\n";
    }
    
}